

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32(CodedInputStream *this,uint32 *value)

{
  int64 iVar1;
  uint *in_RSI;
  CodedInputStream *in_RDI;
  int64 result;
  uint32 v;
  uint32 in_stack_00000064;
  CodedInputStream *in_stack_00000068;
  bool local_1;
  
  if ((in_RDI->buffer_ < in_RDI->buffer_end_) && (*in_RDI->buffer_ < 0x80)) {
    *in_RSI = (uint)*in_RDI->buffer_;
    Advance(in_RDI,1);
    local_1 = true;
  }
  else {
    iVar1 = ReadVarint32Fallback(in_stack_00000068,in_stack_00000064);
    *in_RSI = (uint)iVar1;
    local_1 = -1 < iVar1;
  }
  return local_1;
}

Assistant:

inline bool CodedInputStream::ReadVarint32(uint32* value) {
  uint32 v = 0;
  if (PROTOBUF_PREDICT_TRUE(buffer_ < buffer_end_)) {
    v = *buffer_;
    if (v < 0x80) {
      *value = v;
      Advance(1);
      return true;
    }
  }
  int64 result = ReadVarint32Fallback(v);
  *value = static_cast<uint32>(result);
  return result >= 0;
}